

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Performance::anon_unknown_1::ShaderOptimizationCase::iterate
          (ShaderOptimizationCase *this)

{
  ShaderPerformanceMeasurer *this_00;
  int iVar1;
  ostringstream *poVar2;
  State SVar3;
  CaseShaderType CVar4;
  TestLog *log;
  TestContext *this_01;
  int precision;
  IterateResult IVar5;
  char *pcVar6;
  int iVar7;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  float local_1d8;
  float local_1d4;
  ScopedLogSection section;
  string local_1c8;
  undefined1 local_1a8 [384];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  SVar3 = this->m_state;
  switch(SVar3) {
  case STATE_INIT_UNOPTIMIZED:
  case STATE_INIT_OPTIMIZED:
    IVar5 = CONTINUE;
    deqp::gls::ShaderPerformanceMeasurer::init
              (&this->m_measurer,
               (EVP_PKEY_CTX *)
               (ulong)(((&this->m_unoptimizedProgram)[SVar3 == STATE_INIT_OPTIMIZED].m_ptr)->
                      m_program).m_program);
    this->m_state = (uint)(SVar3 == STATE_INIT_OPTIMIZED) * 2 + STATE_MEASURE_UNOPTIMIZED;
    break;
  case STATE_MEASURE_UNOPTIMIZED:
  case STATE_MEASURE_OPTIMIZED:
    this_00 = &this->m_measurer;
    deqp::gls::ShaderPerformanceMeasurer::iterate(this_00);
    IVar5 = CONTINUE;
    if ((this->m_measurer).m_state == STATE_FINISHED) {
      SVar3 = this->m_state;
      pcVar6 = "UnoptimizedResult";
      if (SVar3 == STATE_MEASURE_OPTIMIZED) {
        pcVar6 = "OptimizedResult";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,pcVar6,&local_1d9);
      pcVar6 = "Measurement result for unoptimized program";
      if (SVar3 == STATE_MEASURE_OPTIMIZED) {
        pcVar6 = "Measurement results for hand-optimized program";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,pcVar6,&local_1da);
      tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_1a8,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)local_1a8);
      deqp::gls::ShaderPerformanceMeasurer::logMeasurementInfo(this_00,log);
      (&this->m_unoptimizedResult)[SVar3 == STATE_MEASURE_OPTIMIZED] = (this->m_measurer).m_result;
      deqp::gls::ShaderPerformanceMeasurer::deinit(this_00);
      this->m_state = (uint)(SVar3 == STATE_MEASURE_OPTIMIZED) * 2 + STATE_INIT_OPTIMIZED;
      tcu::ScopedLogSection::~ScopedLogSection(&section);
    }
    break;
  default:
    CVar4 = this->m_caseShaderType;
    local_1d8 = (&(this->m_unoptimizedResult).megaVertPerSec)[CVar4 != CASESHADERTYPE_VERTEX] /
                (&(this->m_optimizedResult).megaVertPerSec)[CVar4 != CASESHADERTYPE_VERTEX];
    local_1d4 = floorf(100.0 / local_1d8 + 0.5);
    poVar2 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Unoptimized / optimized ");
    pcVar6 = "Vertex and fragment";
    if (CVar4 == CASESHADERTYPE_VERTEX) {
      pcVar6 = "Unexpected vertex";
    }
    std::operator<<((ostream *)poVar2,pcVar6 + 0xb);
    std::operator<<((ostream *)poVar2," performance ratio: ");
    std::ostream::operator<<(poVar2,local_1d8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    iVar7 = (int)local_1d4;
    iVar1 = iVar7 + -100;
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    poVar2 = (ostringstream *)(local_1a8 + 8);
    if (iVar1 < 0) {
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"Note: hand-optimization degraded performance by ");
      std::ostream::operator<<(poVar2,100 - iVar7);
      std::operator<<((ostream *)poVar2,"%");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1a8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"Note: ");
      std::ostream::operator<<(poVar2,iVar1);
      std::operator<<((ostream *)poVar2,
                      "% performance gain was achieved with hand-optimized version");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    de::floatToString_abi_cxx11_((string *)local_1a8,(de *)0x2,local_1d8,precision);
    IVar5 = STOP;
    tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)local_1a8._0_8_);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  return IVar5;
}

Assistant:

ShaderOptimizationCase::IterateResult ShaderOptimizationCase::iterate (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_state == STATE_INIT_UNOPTIMIZED || m_state == STATE_INIT_OPTIMIZED)
	{
		const bool optimized = m_state == STATE_INIT_OPTIMIZED;
		m_measurer.init(program(optimized)->getProgram(), programData(optimized).attributes, 1);
		m_state = optimized ? STATE_MEASURE_OPTIMIZED : STATE_MEASURE_UNOPTIMIZED;

		return CONTINUE;
	}
	else if (m_state == STATE_MEASURE_UNOPTIMIZED || m_state == STATE_MEASURE_OPTIMIZED)
	{
		m_measurer.iterate();

		if (m_measurer.isFinished())
		{
			const bool						optimized	= m_state == STATE_MEASURE_OPTIMIZED;
			const tcu::ScopedLogSection		section		(log, optimized ? "OptimizedResult"									: "UnoptimizedResult",
															  optimized ? "Measurement results for hand-optimized program"	: "Measurement result for unoptimized program");
			m_measurer.logMeasurementInfo(log);
			result(optimized) = m_measurer.getResult();
			m_measurer.deinit();
			m_state = optimized ? STATE_FINISHED : STATE_INIT_OPTIMIZED;
		}

		return CONTINUE;
	}
	else
	{
		DE_ASSERT(m_state == STATE_FINISHED);

		const float			unoptimizedRelevantResult	= m_caseShaderType == CASESHADERTYPE_VERTEX ? m_unoptimizedResult.megaVertPerSec	: m_unoptimizedResult.megaFragPerSec;
		const float			optimizedRelevantResult		= m_caseShaderType == CASESHADERTYPE_VERTEX ? m_optimizedResult.megaVertPerSec		: m_optimizedResult.megaFragPerSec;
		const char* const	relevantResultName			= m_caseShaderType == CASESHADERTYPE_VERTEX ? "vertex"								: "fragment";
		const float			ratio						= unoptimizedRelevantResult / optimizedRelevantResult;
		const int			handOptimizationGain		= (int)deFloatRound(100.0f/ratio) - 100;

		log << TestLog::Message << "Unoptimized / optimized " << relevantResultName << " performance ratio: " << ratio << TestLog::EndMessage;

		if (handOptimizationGain >= 0)
			log << TestLog::Message << "Note: " << handOptimizationGain << "% performance gain was achieved with hand-optimized version" << TestLog::EndMessage;
		else
			log << TestLog::Message << "Note: hand-optimization degraded performance by " << -handOptimizationGain << "%" << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(ratio, 2).c_str());

		return STOP;
	}
}